

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void sort_on_value<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>>
               (__normal_iterator<result_*,_std::vector<result,_std::allocator<result>_>_> first,
               __normal_iterator<result_*,_std::vector<result,_std::allocator<result>_>_> last,
               objective_function_type type)

{
  if (type == minimize) {
    std::
    __sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__ops::_Iter_comp_iter<sort_on_value<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>>(__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,baryonyx::objective_function_type)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ();
    return;
  }
  if (first._M_current != last._M_current) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<sort_on_value<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>>(__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,baryonyx::objective_function_type)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (first._M_current,last._M_current,
               (int)LZCOUNT(((long)last._M_current - (long)first._M_current) / 0x18) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__ops::_Iter_comp_iter<sort_on_value<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>>(__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,baryonyx::objective_function_type)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (first._M_current,last._M_current);
    return;
  }
  return;
}

Assistant:

void
sort_on_value(Iterator first,
              Iterator last,
              baryonyx::objective_function_type type)
{
    if (type == baryonyx::objective_function_type::minimize)
        std::sort(first, last, [](const auto& lhs, const auto& rhs) {
            if (is_valid(lhs.value)) {
                if (is_valid(rhs.value)) {
                    return lhs.value < rhs.value;
                } else {
                    return true;
                }
            } else {
                return false;
            }
        });
    else
        std::sort(first, last, [](const auto& lhs, const auto& rhs) {
            if (is_valid(lhs.value)) {
                if (is_valid(rhs.value)) {
                    return lhs.value > rhs.value;
                } else {
                    return true;
                }
            } else {
                return false;
            }
        });
}